

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeSerializer.cpp
# Opt level: O1

uint32 __thiscall
Js::ByteCodeBufferBuilder::PrependConstantInt32
          (ByteCodeBufferBuilder *this,BufferBuilderList *builder,LPCWSTR clue,int value,
          ConstantSizedBufferBuilderOf<int> **entryOut)

{
  ImmutableList<Js::BufferBuilder_*> *pIVar1;
  BufferBuilder *pBVar2;
  ImmutableList<Js::BufferBuilder_*> *pIVar3;
  
  pBVar2 = (BufferBuilder *)new<Memory::ArenaAllocator>(0x18,this->alloc,0x366bee);
  pBVar2->clue = clue;
  pBVar2->offset = 0xffffffff;
  *(int *)&pBVar2->field_0x14 = value;
  pBVar2->_vptr_BufferBuilder = (_func_int **)&PTR_FixOffset_014f2d38;
  pIVar1 = builder->list;
  pIVar3 = (ImmutableList<Js::BufferBuilder_*> *)
           new<Memory::ArenaAllocator>(0x10,this->alloc,0x366bee);
  pIVar3->value = pBVar2;
  pIVar3->next = pIVar1;
  builder->list = pIVar3;
  if (entryOut != (ConstantSizedBufferBuilderOf<int> **)0x0) {
    *entryOut = (ConstantSizedBufferBuilderOf<int> *)pBVar2;
  }
  return 4;
}

Assistant:

uint32 PrependConstantInt32(BufferBuilderList & builder, LPCWSTR clue, int value, ConstantSizedBufferBuilderOf<int> ** entryOut = nullptr)
    {
        auto entry = Anew(alloc, ConstantSizedBufferBuilderOf<int>, clue, value);
        builder.list = builder.list->Prepend(entry, alloc);
        if (entryOut)
        {
            *entryOut = entry;
        }
        return sizeof(int32);
    }